

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_mathutils.cc
# Opt level: O0

bool RigidBodyDynamics::Math::SpatialMatrixCompareEpsilon
               (SpatialMatrix *matrix_a,SpatialMatrix *matrix_b,double epsilon)

{
  CoeffReturnType pdVar1;
  ostream *poVar2;
  double in_XMM0_Qa;
  uint j;
  uint i;
  DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *in_stack_00000218;
  ostream *in_stack_00000220;
  Index in_stack_ffffffffffffffc8;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0> *in_stack_ffffffffffffffd0;
  uint local_28;
  uint local_24;
  
  local_24 = 0;
  do {
    if (5 < local_24) {
      return true;
    }
    for (local_28 = 0; local_28 < 6; local_28 = local_28 + 1) {
      pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>::operator()
                         (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x121110);
      in_stack_ffffffffffffffd0 =
           (DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0> *)*pdVar1;
      pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_0>::operator()
                         (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x121130);
      if (in_XMM0_Qa <= ABS((double)in_stack_ffffffffffffffd0 - *pdVar1)) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Expected:");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = Eigen::operator<<(in_stack_00000220,in_stack_00000218);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = std::operator<<(poVar2,"but was");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = Eigen::operator<<(in_stack_00000220,in_stack_00000218);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        return false;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

RBDL_DLLAPI
bool SpatialMatrixCompareEpsilon (const SpatialMatrix &matrix_a, const SpatialMatrix &matrix_b, double epsilon) {
	assert (epsilon >= 0.);
	unsigned int i, j;

	for (i = 0; i < 6; i++) {
		for (j = 0; j < 6; j++) {
			if (fabs(matrix_a(i,j) - matrix_b(i,j)) >= epsilon) {
				std::cerr << "Expected:" 
					<< std::endl << matrix_a << std::endl
					<< "but was" << std::endl 
					<< matrix_b << std::endl;
				return false;
			}
		}
	}

	return true;
}